

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  pointer pcVar1;
  size_type sVar2;
  EnumValueDescriptor *pEVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar4;
  ulong uVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  string_view element_name;
  string_view element_name_00;
  anon_class_24_3_0c655f7d make_error;
  EnumValueDescriptor *enum_value;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  insert_result;
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  undefined4 local_c4;
  EnumDescriptorProto *local_c0;
  EnumDescriptor *local_b8;
  DescriptorBuilder *local_b0;
  _Head_base<0UL,_int_&&,_false> local_a8;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_a0;
  undefined1 *local_98;
  undefined1 local_90 [16];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_80;
  VoidPtr local_68;
  code *pcStack_60;
  undefined1 local_58 [40];
  
  local_c0 = proto;
  local_b8 = enm;
  local_b0 = this;
  CheckEnumValueUniqueness(this,proto,enm);
  if ((((enm->merged_features_->field_0)._impl_.enum_type_ != 2) && (0 < enm->value_count_)) &&
     (enm->values_->number_ != 0)) {
    pcVar1 = enm->all_names_[1]._M_dataplus._M_p;
    sVar2 = enm->all_names_[1]._M_string_length;
    pVVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                       (&(local_c0->field_0)._impl_.value_.super_RepeatedPtrFieldBase,0);
    element_name._M_str = pcVar1;
    element_name._M_len = sVar2;
    AddError(local_b0,element_name,&pVVar4->super_Message,NUMBER,
             "The first enum value must be zero for open enums.");
  }
  if (((*(byte *)((long)&enm->options_->field_0 + 0x18) & 2) == 0) ||
     ((enm->options_->field_0)._impl_.allow_alias_ == false)) {
    local_58._0_8_ = 0;
    local_58._8_8_ = 0;
    local_58._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    uVar5 = (ulong)(uint)enm->value_count_;
    if (0 < enm->value_count_) {
      local_c0 = (EnumDescriptorProto *)&(local_c0->field_0)._impl_.value_;
      lVar8 = 0;
      lVar7 = 0;
      do {
        if ((int)uVar5 <= lVar7) {
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar7,(long)(int)uVar5,"index < value_count()");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)(local_90 + 0x10),
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xa27,*(undefined8 *)(psVar6 + 8),*(undefined8 *)psVar6);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)(local_90 + 0x10));
        }
        pEVar3 = enm->values_;
        local_90._0_8_ = &pEVar3->super_SymbolBaseN<0> + lVar8;
        local_c4 = *(undefined4 *)((long)&pEVar3->number_ + lVar8);
        local_a0._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)((long)&pEVar3->all_names_ + lVar8) + 0x20);
        local_a8._M_head_impl = &local_c4;
        local_90._8_8_ = local_58;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                    *)(local_90 + 0x10),local_90 + 8,&local_c4,
                   (piecewise_construct_t *)&std::piecewise_construct,(tuple<int_&&> *)&local_a8,
                   (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&local_a0);
        if ((local_80.second == false) &&
           ((local_b8->options_->field_0)._impl_.allow_alias_ == false)) {
          local_a8._M_head_impl = (int *)&local_b8;
          local_a0._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
          local_98 = local_90 + 0x10;
          pcVar1 = local_b8->all_names_[1]._M_dataplus._M_p;
          sVar2 = local_b8->all_names_[1]._M_string_length;
          pVVar4 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                             ((RepeatedPtrFieldBase *)local_c0,(int)lVar7);
          pcStack_60 = absl::lts_20240722::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          local_68.obj = &local_a8;
          make_error_00.invoker_ =
               absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = local_68.obj;
          element_name_00._M_str = pcVar1;
          element_name_00._M_len = sVar2;
          AddError(local_b0,element_name_00,&pVVar4->super_Message,NUMBER,make_error_00);
        }
        lVar7 = lVar7 + 1;
        uVar5 = (ulong)local_b8->value_count_;
        lVar8 = lVar8 + 0x30;
        enm = local_b8;
      } while (lVar7 < (long)uVar5);
    }
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_58);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const EnumDescriptor* enm,
                                        const EnumDescriptorProto& proto) {
  CheckEnumValueUniqueness(proto, enm);

  if (!enm->is_closed() && enm->value_count() > 0 &&
      enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero for open enums.");
  }

  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    absl::flat_hash_map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      auto insert_result =
          used_values.emplace(enum_value->number(), enum_value->full_name());
      bool inserted = insert_result.second;
      if (!inserted) {
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          auto make_error = [&] {
            // Find the next free number.
            absl::flat_hash_set<int64_t> used;
            for (int j = 0; j < enm->value_count(); ++j) {
              used.insert(enm->value(j)->number());
            }
            int64_t next_value = static_cast<int64_t>(enum_value->number()) + 1;
            while (used.contains(next_value)) ++next_value;

            std::string error = absl::StrCat(
                "\"", enum_value->full_name(),
                "\" uses the same enum value as \"",
                insert_result.first->second,
                "\". If this is intended, set "
                "'option allow_alias = true;' to the enum definition.");
            if (next_value < std::numeric_limits<int32_t>::max()) {
              absl::StrAppend(&error, " The next available enum value is ",
                              next_value, ".");
            }
            return error;
          };
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
        }
      }
    }
  }
}